

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O0

char * PVIP_string_c_str(PVIPString *str)

{
  char *pcVar1;
  PVIPString *str_local;
  
  if (str->buflen == str->len) {
    str->buflen = str->buflen + 1;
    pcVar1 = (char *)realloc(str->buf,str->buflen);
    str->buf = pcVar1;
    if (str->buf == (char *)0x0) {
      return (char *)0x0;
    }
  }
  str->buf[str->len] = '\0';
  return str->buf;
}

Assistant:

const char *PVIP_string_c_str(PVIPString *str) {
    if (str->buflen == str->len) {
        str->buflen++;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return NULL;
        }
    }
    str->buf[str->len+1-1] = '\0';
    return str->buf;
}